

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O3

void __thiscall caffe::V1LayerParameter::add_top(V1LayerParameter *this,string *value)

{
  int iVar1;
  Arena *this_00;
  string *elem;
  int iVar2;
  Rep *pRVar3;
  
  pRVar3 = (this->top_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
    iVar2 = (this->top_).super_RepeatedPtrFieldBase.total_size_;
LAB_0042e635:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->top_).super_RepeatedPtrFieldBase,iVar2 + 1);
    pRVar3 = (this->top_).super_RepeatedPtrFieldBase.rep_;
    iVar2 = pRVar3->allocated_size;
  }
  else {
    iVar1 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
    iVar2 = pRVar3->allocated_size;
    if (iVar1 < iVar2) {
      (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (string *)pRVar3->elements[iVar1];
      goto LAB_0042e6c9;
    }
    if (iVar2 == (this->top_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0042e635;
  }
  pRVar3->allocated_size = iVar2 + 1;
  this_00 = (this->top_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (string *)operator_new(0x20);
    *(string **)elem = elem + 0x10;
    *(long *)(elem + 8) = 0;
    elem[0x10] = (string)0x0;
  }
  else {
    elem = (string *)
           google::protobuf::Arena::AllocateAligned
                     (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *(string **)elem = elem + 0x10;
    *(long *)(elem + 8) = 0;
    elem[0x10] = (string)0x0;
    google::protobuf::Arena::AddListNode
              (this_00,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>)
    ;
    pRVar3 = (this->top_).super_RepeatedPtrFieldBase.rep_;
  }
  iVar2 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
  (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
  pRVar3->elements[iVar2] = elem;
LAB_0042e6c9:
  std::__cxx11::string::_M_assign(elem);
  return;
}

Assistant:

inline void V1LayerParameter::add_top(const ::std::string& value) {
  top_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:caffe.V1LayerParameter.top)
}